

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O2

bool __thiscall DIS::ActionResponsePdu::operator==(ActionResponsePdu *this,ActionResponsePdu *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pFVar5;
  pointer pVVar6;
  bool bVar7;
  bool bVar8;
  undefined4 unaff_EBP;
  undefined4 uVar9;
  size_t idx;
  ulong uVar10;
  size_t idx_1;
  long lVar11;
  undefined1 auVar12 [16];
  
  bVar7 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  uVar1 = this->_requestID;
  uVar3 = this->_requestStatus;
  uVar2 = rhs->_requestID;
  uVar4 = rhs->_requestStatus;
  auVar12._4_4_ = -(uint)(uVar2 == uVar1);
  auVar12._0_4_ = -(uint)(uVar2 == uVar1);
  auVar12._8_4_ = -(uint)(uVar4 == uVar3);
  auVar12._12_4_ = -(uint)(uVar4 == uVar3);
  uVar9 = movmskpd(unaff_EBP,auVar12);
  bVar7 = (bool)((byte)uVar9 >> 1 & bVar7 & (byte)uVar9);
  lVar11 = 0;
  for (uVar10 = 0;
      pFVar5 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->_fixedDatums).
                             super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4);
      uVar10 = uVar10 + 1) {
    bVar8 = FixedDatum::operator==
                      ((FixedDatum *)((long)&pFVar5->_vptr_FixedDatum + lVar11),
                       (FixedDatum *)
                       ((long)&((rhs->_fixedDatums).
                                super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                       lVar11));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar11 = lVar11 + 0x10;
  }
  lVar11 = 0;
  for (uVar10 = 0;
      pVVar6 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar10 < (ulong)(((long)(this->_variableDatums).
                              super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6) / 0x30);
      uVar10 = uVar10 + 1) {
    bVar8 = VariableDatum::operator==
                      ((VariableDatum *)((long)&pVVar6->_vptr_VariableDatum + lVar11),
                       (VariableDatum *)
                       ((long)&((rhs->_variableDatums).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                       lVar11));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar11 = lVar11 + 0x30;
  }
  return bVar7;
}

Assistant:

bool ActionResponsePdu::operator ==(const ActionResponsePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_requestStatus == rhs._requestStatus) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }